

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_block.cpp
# Opt level: O3

BlockInformationStruct *
cfd::js::api::ElementsBlockStructApi::GetBlockInfo
          (BlockInformationStruct *__return_storage_ptr__,BlockDataStruct *request)

{
  string *in_R8;
  undefined1 local_1d8 [40];
  _Any_data local_1b0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [96];
  string local_130 [32];
  string asStack_110 [40];
  uint32_t local_e8;
  int local_e0;
  string asStack_d8 [32];
  string asStack_b8 [40];
  _Rb_tree_node_base local_90;
  size_t local_70;
  _Rb_tree_node_base local_60;
  size_t local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  BlockInformationStruct::BlockInformationStruct(__return_storage_ptr__);
  local_1d8._0_8_ = 0;
  local_1d8._8_8_ = (pointer)0x0;
  local_1d8._24_8_ =
       std::
       _Function_handler<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_block.cpp:26:7)>
       ::_M_invoke;
  local_1d8._16_8_ =
       std::
       _Function_handler<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_block.cpp:26:7)>
       ::_M_manager;
  local_1b0._M_unused._M_object = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"GetBlockInfo","");
  ExecuteStructApi<cfd::js::api::BlockDataStruct,cfd::js::api::BlockInformationStruct>
            ((BlockInformationStruct *)local_190,(api *)request,(BlockDataStruct *)local_1d8,
             (function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)>
              *)&local_1b0,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_190);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->tx).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->tx).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_190._48_8_;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->tx).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->tx).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->tx).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_190._32_8_;
  (__return_storage_ptr__->tx).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_190._40_8_;
  local_190._32_8_ = (pointer)0x0;
  local_190._40_8_ = (pointer)0x0;
  local_190._48_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  __return_storage_ptr__->version = local_190._56_4_;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->version_hex,(string *)(local_190 + 0x40));
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->previousblockhash,local_130);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->merkleroot,asStack_110);
  *(undefined8 *)&__return_storage_ptr__->time = asStack_110._32_8_;
  __return_storage_ptr__->nonce = local_e8;
  (__return_storage_ptr__->error).code = local_e0;
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).type,asStack_d8);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).message,asStack_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (local_90._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_90._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_90._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_90._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_90._M_right;
    (local_90._M_parent)->_M_parent =
         &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_70;
    local_90._M_parent = (_Base_ptr)0x0;
    local_70 = 0;
    local_90._M_left = &local_90;
    local_90._M_right = &local_90;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (local_60._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_60._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_60._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_60._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_right;
    (local_60._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_40;
    local_60._M_parent = (_Base_ptr)0x0;
    local_40 = 0;
    local_60._M_left = &local_60;
    local_60._M_right = &local_60;
  }
  BlockInformationStruct::~BlockInformationStruct((BlockInformationStruct *)local_190);
  if ((undefined1 *)local_1b0._M_unused._0_8_ != local_1a0) {
    operator_delete(local_1b0._M_unused._M_object);
  }
  if ((code *)local_1d8._16_8_ != (code *)0x0) {
    (*(code *)local_1d8._16_8_)(local_1d8,local_1d8,3);
  }
  return __return_storage_ptr__;
}

Assistant:

BlockInformationStruct ElementsBlockStructApi::GetBlockInfo(
    const BlockDataStruct& request) {
  auto call_func =
      [](const BlockDataStruct& request) -> BlockInformationStruct {  // NOLINT
    warn(CFD_LOG_SOURCE, "not implements. block:{}", request.block);
    throw CfdException(CfdError::kCfdIllegalStateError, "Not implements.");
  };

  BlockInformationStruct result;
  result = ExecuteStructApi<BlockDataStruct, BlockInformationStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}